

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void __thiscall QMessagePattern::QMessagePattern(QMessagePattern *this)

{
  rep rVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->timeArgs).d.d = (Data *)0x0;
  (this->timeArgs).d.ptr = (QString *)0x0;
  (this->literals)._M_t.
  super___uniq_ptr_impl<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
  .super__Head_base<0UL,_std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_false>
  ._M_head_impl = (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)0x0;
  (this->tokens)._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
  .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  (this->timeArgs).d.size = 0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->appStartTime).__d.__r = rVar1;
  (this->backtraceArgs).d.d = (Data *)0x0;
  (this->backtraceArgs).d.ptr = (BacktraceParams *)0x0;
  *(undefined8 *)((long)&(this->backtraceArgs).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->backtraceArgs).d.size + 4) = 0;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((QString *)&local_48,"QT_MESSAGE_PATTERN");
  bVar2 = (undefined1 *)local_48.size == (undefined1 *)0x0;
  if (bVar2) {
    setDefaultPattern(this);
  }
  else {
    setPattern(this,(QString *)&local_48);
  }
  this->fromEnvironment = !bVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessagePattern::QMessagePattern()
{
    const QString envPattern = qEnvironmentVariable("QT_MESSAGE_PATTERN");
    if (envPattern.isEmpty()) {
        setDefaultPattern();
        fromEnvironment = false;
    } else {
        setPattern(envPattern);
        fromEnvironment = true;
    }
}